

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_tri_qua_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  REF_INT RVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c [27];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    pcVar14 = "create";
    uVar7 = 0x1f7;
    goto LAB_00118adf;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 1;
  iVar9 = ref_mpi->n;
  iVar6 = ref_mpi->id;
  iVar8 = 0;
  iVar5 = (int)(4 / (long)iVar9);
  iVar12 = iVar5 * iVar9;
  if (4 < iVar12) {
    iVar8 = ((((iVar9 + 4) / iVar9) * (iVar12 + -5)) / iVar5 - iVar12) + 5;
  }
  if (iVar6 == iVar8) {
LAB_00118ba4:
    uVar4 = ref_node_add(ref_node,0,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x207,"ref_fixture_tri_qua_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar9 = ref_mpi->n;
    iVar6 = (iVar9 + 4) / iVar9;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar9);
      iVar9 = 5 - iVar9 * iVar5;
      RVar10 = iVar9 + (int)((lVar11 - iVar6 * iVar9) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,1,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x208,"ref_fixture_tri_qua_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar9 = ref_mpi->n;
    iVar6 = (iVar9 + 4) / iVar9;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar9);
      iVar9 = 5 - iVar9 * iVar5;
      RVar10 = iVar9 + (int)((lVar11 - iVar6 * iVar9) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,2,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x209,"ref_fixture_tri_qua_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar9 = ref_mpi->n;
    iVar6 = (iVar9 + 4) / iVar9;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar9);
      iVar9 = 5 - iVar9 * iVar5;
      RVar10 = iVar9 + (int)((lVar11 - iVar6 * iVar9) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[3],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x20b,"ref_fixture_tri_qua_grid",(ulong)uVar4,"add tri");
      return uVar4;
    }
  }
  else {
    iVar9 = (iVar9 + 4) / iVar9;
    iVar8 = 0;
    if (iVar9 + 1U < 3) {
      iVar8 = iVar9;
    }
    iVar12 = 5 - iVar12;
    if (iVar12 <= iVar8) {
      iVar8 = (1 - iVar9 * iVar12) / iVar5 + iVar12;
    }
    if (iVar6 == iVar8) goto LAB_00118ba4;
    iVar8 = (int)(2 / (long)iVar9);
    if (iVar12 <= iVar8) {
      iVar8 = (2 - iVar9 * iVar12) / iVar5 + iVar12;
    }
    if (iVar6 == iVar8) goto LAB_00118ba4;
  }
  iVar9 = ref_mpi->n;
  iVar6 = ref_mpi->id;
  iVar8 = 0;
  iVar5 = (int)(4 / (long)iVar9);
  iVar12 = iVar5 * iVar9;
  if (4 < iVar12) {
    iVar8 = ((((iVar9 + 4) / iVar9) * (iVar12 + -5)) / iVar5 - iVar12) + 5;
  }
  if (iVar6 == iVar8) {
LAB_00119071:
    uVar4 = ref_node_add(ref_node,0,&local_a8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x21b,"ref_fixture_tri_qua_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    lVar13 = (long)local_a8;
    pRVar3 = pRVar2 + lVar13 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar9 = ref_mpi->n;
    iVar6 = (iVar9 + 4) / iVar9;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar9);
      iVar9 = 5 - iVar9 * iVar5;
      RVar10 = iVar9 + (int)((lVar11 - iVar6 * iVar9) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,4,&local_a4);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x21c,"ref_fixture_tri_qua_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a4;
    pRVar3[lVar13 * 0xf] = -1.0;
    pRVar3 = pRVar3 + lVar13 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar9 = ref_mpi->n;
    iVar6 = (iVar9 + 4) / iVar9;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar9);
      iVar9 = 5 - iVar9 * iVar5;
      RVar10 = iVar9 + (int)((lVar11 - iVar6 * iVar9) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,3,&local_a0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x21d,"ref_fixture_tri_qua_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_a0;
    pRVar3[lVar13 * 0xf] = -1.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar9 = ref_mpi->n;
    iVar6 = (iVar9 + 4) / iVar9;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar9);
      iVar9 = 5 - iVar9 * iVar5;
      RVar10 = iVar9 + (int)((lVar11 - iVar6 * iVar9) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_node_add(ref_node,1,local_9c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x21e,"ref_fixture_tri_qua_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar13 = (long)local_9c[0];
    pRVar3[lVar13 * 0xf] = 0.0;
    pRVar3[lVar13 * 0xf + 1] = 1.0;
    pRVar3[lVar13 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar13) && (local_9c[0] < ref_node->max)) && (-1 < ref_node->global[lVar13])) {
      lVar11 = ref_node->global[lVar13];
    }
    iVar9 = ref_mpi->n;
    iVar6 = (iVar9 + 4) / iVar9;
    if (lVar11 / (long)iVar6 < (long)(ulong)((int)(4 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar6);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_9c[0]) && (local_9c[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar13]) {
          lVar11 = ref_node->global[lVar13];
        }
      }
      iVar5 = (int)(4 / (long)iVar9);
      iVar9 = 5 - iVar9 * iVar5;
      RVar10 = iVar9 + (int)((lVar11 - iVar6 * iVar9) / (long)iVar5);
    }
    ref_node->part[lVar13] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[6],&local_a8,&local_ac);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x220,"ref_fixture_tri_qua_grid",(ulong)uVar4,"add tri");
      return uVar4;
    }
  }
  else {
    iVar9 = (iVar9 + 4) / iVar9;
    iVar8 = (int)(4 / (long)iVar9);
    iVar12 = 5 - iVar12;
    if (iVar12 <= iVar8) {
      iVar8 = (4 - iVar9 * iVar12) / iVar5 + iVar12;
    }
    if (iVar6 == iVar8) goto LAB_00119071;
    iVar8 = (int)(3 / (long)iVar9);
    if (iVar12 <= iVar8) {
      iVar8 = (3 - iVar9 * iVar12) / iVar5 + iVar12;
    }
    if (iVar6 == iVar8) goto LAB_00119071;
    iVar8 = 0;
    if (iVar9 + 1U < 3) {
      iVar8 = iVar9;
    }
    if (iVar12 <= iVar8) {
      iVar8 = (1 - iVar9 * iVar12) / iVar5 + iVar12;
    }
    if (iVar6 == iVar8) goto LAB_00119071;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,5);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar14 = "init glob";
  uVar7 = 0x223;
LAB_00118adf:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar7,
         "ref_fixture_tri_qua_grid",(ulong)uVar4,pcVar14);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri_qua_grid(REF_GRID *ref_grid_ptr,
                                            REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 5;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 1.0, 0.0);
    add_that_node(2, 1.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 0;
  global[1] = 4;
  global[2] = 3;
  global[3] = 1;
  global[4] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, -1.0, 0.0, 0.0);
    add_that_node(2, -1.0, 1.0, 0.0);
    add_that_node(3, 0.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  return REF_SUCCESS;
}